

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O3

void __thiscall asl::XdlEncoder::_encode(XdlEncoder *this,Var *v)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  int iVar5;
  Var *pVVar6;
  char *_class;
  Var *pVVar7;
  undefined8 extraout_RAX;
  int *piVar8;
  String *pSVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar10;
  int iVar11;
  char b;
  anon_union_8_8_7df20137_for_Var_3 x;
  anon_union_16_2_78e7fdac_for_String_2 *paVar12;
  anon_union_16_2_78e7fdac_for_String_2 *b_00;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  Var *pVVar16;
  String s;
  undefined1 local_a8 [24];
  int local_90;
  int local_88;
  undefined8 local_80;
  undefined8 local_78;
  Var *local_70;
  String *local_68;
  int *local_60;
  anon_union_16_2_78e7fdac_for_String_2 *local_58;
  String *local_50;
  String local_48;
  
  local_70 = v;
  switch(v->_type) {
  case NONE:
  case NUL:
    String::append(&this->_out,"null",4);
    break;
  case NUMBER:
    new_number(this,(v->field_1)._d);
    break;
  case BOOL:
    new_bool(this,(v->field_1)._b);
    break;
  case INT:
    new_number(this,(v->field_1)._i);
    break;
  case SSTRING:
    x._l = (Long)&v->field_1;
    goto LAB_0012b651;
  case FLOAT:
    new_number(this,(float)(v->field_1)._d);
    break;
  case STRING:
    x = v->field_1;
LAB_0012b651:
    new_string(this,(char *)x);
    break;
  case ARRAY:
    String::operator+=(&this->_out,'[');
    iVar13 = Var::length(local_70);
    uVar10 = extraout_RDX;
    pVVar6 = local_70;
    if (0 < iVar13) {
      pVVar6 = Var::operator[](local_70,0);
      uVar10 = extraout_RDX_00;
    }
    if (this->_pretty == true) {
      if (iVar13 - 0xbU < 0xfffffff6) {
        if (iVar13 < 0xb) {
          TVar4 = pVVar6->_type;
LAB_0012ba97:
          if (((TVar4 == STRING) || (TVar4 == SSTRING)) && (iVar11 = 0, 0 < iVar13)) {
            iVar3 = 0;
            do {
              pVVar16 = Var::operator[](local_70,iVar11);
              iVar5 = Var::length(pVVar16);
              iVar3 = iVar5 + iVar3;
              if (100 < iVar3) goto LAB_0012b6f2;
              iVar11 = iVar11 + 1;
            } while (iVar13 != iVar11);
          }
          goto LAB_0012bad4;
        }
LAB_0012b6f2:
        if ((iVar13 < 1) || (DIC < pVVar6->_type)) {
          local_80 = (Var *)((ulong)local_80._4_4_ << 0x20);
        }
        else {
          local_80 = (Var *)CONCAT44(local_80._4_4_,0x720 >> ((byte)pVVar6->_type & 0x1f));
        }
      }
      else {
        TVar4 = pVVar6->_type;
        local_80 = (Var *)CONCAT44(local_80._4_4_,(int)CONCAT71((int7)((ulong)uVar10 >> 8),1));
        if (1 < TVar4 - ARRAY) goto LAB_0012ba97;
      }
      uVar14 = this->_level + 1;
      this->_level = uVar14;
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = 0;
      }
      String::alloc((String *)local_a8,(uint)uVar15);
      pVVar6 = (Var *)(local_a8 + 8);
      pVVar16 = pVVar6;
      if (local_a8._0_4_ != 0) {
        pVVar16 = (Var *)local_a8._8_8_;
      }
      *(undefined1 *)((long)&pVVar16->_type + uVar15) = 0;
      pVVar16 = pVVar6;
      if (local_a8._0_4_ != 0) {
        pVVar16 = (Var *)local_a8._8_8_;
      }
      local_a8._4_4_ = (uint)uVar15;
      memset(pVVar16,9,uVar15);
      *(undefined1 *)((long)&pVVar16->_type + uVar15) = 0;
      if (local_a8._0_4_ != 0) {
        pVVar6 = (Var *)local_a8._8_8_;
      }
      String::assign(&this->_indent,(char *)pVVar6,local_a8._4_4_);
      if (local_a8._0_4_ != 0) {
        free((void *)local_a8._8_8_);
      }
      String::operator+=(&this->_out,'\n');
      if ((this->_indent)._size == 0) {
        paVar12 = &(this->_indent).field_2;
      }
      else {
        paVar12 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
      }
      String::append(&this->_out,paVar12->_space,(this->_indent)._len);
      local_78 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT44(local_78._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
    }
    else {
LAB_0012bad4:
      local_78 = (anon_union_16_2_78e7fdac_for_String_2 *)((ulong)local_78._4_4_ << 0x20);
      local_80 = (Var *)((ulong)local_80 & 0xffffffff00000000);
    }
    iVar13 = Var::length(local_70);
    pVVar6 = local_70;
    if (0 < iVar13) {
      paVar12 = &(this->_sep1).field_2;
      piVar1 = &(this->_sep1)._len;
      local_68 = (String *)&(this->_sep2).field_2;
      local_50 = &this->_indent;
      local_58 = &(this->_indent).field_2;
      local_60 = &(this->_indent)._len;
      uVar14 = 0;
      local_80 = (Var *)CONCAT44(local_80._4_4_,
                                 CONCAT31((int3)((ulong)local_80 >> 8),~(byte)local_80));
      do {
        if (uVar14 != 0) {
          piVar8 = piVar1;
          pSVar9 = &this->_sep1;
          b_00 = paVar12;
          if (((char)local_78 != '\0') && (((byte)local_80 & (uVar14 & 0xf) != 0) == 0)) {
            pSVar9 = local_68;
            if ((this->_sep2)._size != 0) {
              pSVar9 = (String *)(this->_sep2).field_2._str;
            }
            String::append(&this->_out,(char *)pSVar9,(this->_sep2)._len);
            String::operator+=(&this->_out,'\n');
            piVar8 = local_60;
            pSVar9 = local_50;
            b_00 = local_58;
          }
          if (pSVar9->_size != 0) {
            b_00 = (anon_union_16_2_78e7fdac_for_String_2 *)b_00->_str;
          }
          String::append(&this->_out,b_00->_space,*piVar8);
        }
        pVVar16 = Var::operator[](pVVar6,uVar14);
        _encode(this,pVVar16);
        uVar14 = uVar14 + 1;
        iVar13 = Var::length(pVVar6);
      } while ((int)uVar14 < iVar13);
    }
    if ((char)local_78 != '\0') {
      uVar14 = this->_level - 1;
      this->_level = uVar14;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      uVar15 = (ulong)uVar14;
      String::alloc((String *)local_a8,uVar14);
      pVVar6 = (Var *)(local_a8 + 8);
      pVVar16 = pVVar6;
      if (local_a8._0_4_ != 0) {
        pVVar16 = (Var *)local_a8._8_8_;
      }
      *(undefined1 *)((long)&pVVar16->_type + uVar15) = 0;
      pVVar16 = pVVar6;
      if (local_a8._0_4_ != 0) {
        pVVar16 = (Var *)local_a8._8_8_;
      }
      local_a8._4_4_ = uVar14;
      memset(pVVar16,9,uVar15);
      *(undefined1 *)((long)&pVVar16->_type + uVar15) = 0;
      if (local_a8._0_4_ != 0) {
        pVVar6 = (Var *)local_a8._8_8_;
      }
      String::assign(&this->_indent,(char *)pVVar6,local_a8._4_4_);
      if (local_a8._0_4_ != 0) {
        free((void *)local_a8._8_8_);
      }
      String::operator+=(&this->_out,'\n');
      if ((this->_indent)._size == 0) {
        paVar12 = &(this->_indent).field_2;
      }
      else {
        paVar12 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
      }
      String::append(&this->_out,paVar12->_space,(this->_indent)._len);
    }
    b = ']';
    goto LAB_0012bd5f;
  case DIC:
    if (this->_json == false) {
      String::String((String *)local_a8,"$type");
      pVVar6 = Var::getp(local_70,(String *)local_a8);
      if (local_a8._0_4_ != 0) {
        free((void *)local_a8._8_8_);
      }
      if (pVVar6 == (Var *)0x0) {
        _class = "";
      }
      else {
        _class = Var::operator*(pVVar6);
      }
      begin_object(this,_class);
    }
    else {
      begin_object(this,"");
      pVVar6 = (Var *)0x0;
    }
    if (this->_pretty == true) {
      uVar14 = this->_level + 1;
      this->_level = uVar14;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      uVar15 = (ulong)uVar14;
      String::alloc((String *)local_a8,uVar14);
      pVVar16 = (Var *)(local_a8 + 8);
      pVVar7 = pVVar16;
      if (local_a8._0_4_ != 0) {
        pVVar7 = (Var *)local_a8._8_8_;
      }
      *(undefined1 *)((long)&pVVar7->_type + uVar15) = 0;
      pVVar7 = pVVar16;
      if (local_a8._0_4_ != 0) {
        pVVar7 = (Var *)local_a8._8_8_;
      }
      local_a8._4_4_ = uVar14;
      memset(pVVar7,9,uVar15);
      *(undefined1 *)((long)&pVVar7->_type + uVar15) = 0;
      if (local_a8._0_4_ != 0) {
        pVVar16 = (Var *)local_a8._8_8_;
      }
      String::assign(&this->_indent,(char *)pVVar16,local_a8._4_4_);
      if (local_a8._0_4_ != 0) {
        free((void *)local_a8._8_8_);
      }
    }
    local_a8._8_8_ = local_70;
    local_88 = 0;
    if (local_70->_type == DIC) {
      local_a8._16_8_ = &local_70->field_1;
      local_90 = 0;
    }
    local_80 = (Var *)(local_a8 + 8);
    local_a8._0_4_ = 1;
    local_68 = &this->_indent;
    local_78 = &(this->_indent).field_2;
    iVar13 = 0;
    while ((iVar11 = local_88, iVar3 = Var::length((Var *)local_a8._8_8_), iVar11 < iVar3 &&
           (local_a8._0_4_ != 0))) {
      iVar11 = *(int *)local_a8._8_8_;
      if (iVar11 == 10) {
        pVVar16 = (Var *)(*(long *)local_a8._16_8_ + (long)local_90 * 0x28 + 0x18);
      }
      else {
        pVVar16 = (Var *)local_a8._8_8_;
        if (iVar11 == 9) {
          pVVar16 = (Var *)((long)local_88 * 0x10 +
                           ((anon_union_8_8_7df20137_for_Var_3 *)(local_a8._8_8_ + 8))->_l);
        }
      }
      if (0 < (int)local_a8._0_4_) {
        do {
          Var::Enumerator::operator~(&local_48,(Enumerator *)(local_a8 + 8));
          for (; local_a8._0_4_ != 0; local_a8._0_4_ = local_a8._0_4_ - 1) {
            if ((pVVar16->_type != NONE) && (pVVar16 != pVVar6 || (this->_json & 1U) != 0)) {
              if (0 < iVar13) {
                paVar12 = &(this->_sep2).field_2;
                if ((this->_sep2)._size != 0) {
                  paVar12 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_sep2).field_2._str;
                }
                String::append(&this->_out,paVar12->_space,(this->_sep2)._len);
              }
              if (this->_pretty == true) {
                String::operator+=(&this->_out,'\n');
                paVar12 = local_78;
                if ((this->_indent)._size != 0) {
                  paVar12 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
                }
                String::append(&this->_out,paVar12->_space,(this->_indent)._len);
              }
              new_property(this,&local_48);
              _encode(this,pVVar16);
              iVar13 = iVar13 + 1;
            }
          }
          if (local_48._size == 0) {
            local_a8._0_4_ = 0xfffffffe;
            break;
          }
          free(local_48.field_2._str);
          uVar14 = local_a8._0_4_ - 2;
          bVar2 = 2 < (int)local_a8._0_4_;
          local_a8._0_4_ = uVar14;
        } while (bVar2);
        iVar11 = *(int *)local_a8._8_8_;
      }
      local_88 = local_88 + 1;
      if (iVar11 == 10) {
        local_90 = local_90 + 1;
      }
      local_a8._0_4_ = ~local_a8._0_4_;
    }
    if (this->_pretty != false) {
      uVar14 = this->_level - 1;
      this->_level = uVar14;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      uVar15 = (ulong)uVar14;
      String::alloc((String *)local_a8,uVar14);
      pVVar6 = (Var *)(local_a8 + 8);
      if (local_a8._0_4_ != 0) {
        pVVar6 = (Var *)local_a8._8_8_;
      }
      *(undefined1 *)((long)&pVVar6->_type + uVar15) = 0;
      pVVar6 = (Var *)(local_a8 + 8);
      if (local_a8._0_4_ != 0) {
        pVVar6 = (Var *)local_a8._8_8_;
      }
      local_a8._4_4_ = uVar14;
      memset(pVVar6,9,uVar15);
      *(undefined1 *)((long)&pVVar6->_type + uVar15) = 0;
      if (local_a8._0_4_ != 0) {
        local_80 = (Var *)local_a8._8_8_;
      }
      String::assign(local_68,(char *)local_80,local_a8._4_4_);
      if (local_a8._0_4_ != 0) {
        free((void *)local_a8._8_8_);
      }
      String::operator+=(&this->_out,'\n');
      if ((this->_indent)._size != 0) {
        local_78 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
      }
      String::append(&this->_out,local_78->_space,(this->_indent)._len);
    }
    b = '}';
LAB_0012bd5f:
    String::operator+=(&this->_out,b);
  }
  if (16000 < (this->_out)._len) {
    (*this->_sink->_vptr_XdlSink[2])(this->_sink,this);
  }
  return;
}

Assistant:

void XdlEncoder::_encode(const Var& v)
{
	switch(v._type)
	{
	case Var::FLOAT:
		new_number((float)v._d);
		break;
	case Var::NUMBER:
		new_number(v._d);
		break;
	case Var::INT:
		new_number(v._i);
		break;
	case Var::STRING:
		new_string(v._s->data());
		break;
	case Var::SSTRING:
		new_string(v._ss);
		break;
	case Var::BOOL:
		new_bool(v._b);
		break;
	case Var::ARRAY: {
		begin_array();
		int n = v.length();
		const Var& v0 = n>0? v[0] : v;
		bool multi = (_pretty && (n > 10 || (n>0  && (v0.is(Var::ARRAY) || v0.is(Var::OBJ)))));
		if (_pretty && !multi && v0.is(Var::STRING))
		{
			for (int i = 0, m = 0; i < n; i++)
				if ((m += v[i].length()) > 100)
				{
					multi = true;
					break;
				}
		}
		bool big = false;
		if(multi)
		{
			big = n > 0 && (v0.is(Var::ARRAY) || v0.is(Var::DIC) || v0.is(Var::STRING));
			_indent = String::repeat(INDENT_CHAR, ++_level);
			_out << '\n' << _indent;
		}
		for(int i=0; i<v.length(); i++)
		{
			if(i>0) {
				if (multi && (big || (i % 16) == 0))
					_out << _sep2 << '\n' << _indent;
				else
					_out << _sep1;
			}
			_encode(v[i]);
		}
		if(multi) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_array();
		break;
		}
	case Var::OBJ: {
		const Var* cname = 0;
		if (!_json)
		{
			cname = v.getp(ASL_XDLCLASS);
			begin_object(cname ? **cname : "");
		}
		else
			begin_object("");
		int k = 0;
		if (_pretty)
			_indent = String::repeat(INDENT_CHAR, ++_level);

		foreach2(String& name, Var& value, v)
		{
			if(value.ok() && (_json || &value != cname))
			{
				if (k++ > 0)
					_out << _sep2;
				if (_pretty)
					_out << '\n' << _indent;

				new_property(name);
				_encode(value);
			}
		}
		if(_pretty) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_object();
		}
		break;
	case Var::NUL:
		_out << "null";
		break;
	case Var::NONE:
		_out << "null";
		break;
	}

	if (_out.length() > 16000)
		_sink->write(_out);
}